

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::AV1ResizeYTest_DISABLED_SpeedTest_Test::
~AV1ResizeYTest_DISABLED_SpeedTest_Test(AV1ResizeYTest_DISABLED_SpeedTest_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__AV1ResizeYTest_010a7410;
  *(undefined ***)this = &PTR__AV1ResizeYTest_010a7450;
  if (*(void **)(this + 0x38) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x38));
  }
  *(undefined8 *)(this + 0x38) = 0;
  if (*(void **)(this + 0x30) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x30));
  }
  *(undefined8 *)(this + 0x30) = 0;
  if (*(void **)(this + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x28));
  }
  *(undefined8 *)(this + 0x28) = 0;
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x10));
  operator_delete((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                   *)(this + -0x10));
  return;
}

Assistant:

TEST_P(AV1ResizeYTest, DISABLED_SpeedTest) { SpeedTest(); }